

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O2

void yy_1_paren_args(GREG *G,char *yytext,int yyleng,yythunk *thunk,PVIPParserContext yyxvar)

{
  PVIPNode *pPVar1;
  
  pPVar1 = G->val[-1];
  if (pPVar1->type == PVIP_NODE_LIST) {
    G->ss = pPVar1;
    PVIP_node_change_type(pPVar1,PVIP_NODE_ARGS);
    return;
  }
  pPVar1 = PVIP_node_new_children1(&G->data,PVIP_NODE_ARGS,pPVar1);
  G->ss = pPVar1;
  return;
}

Assistant:

YY_ACTION(void) yy_1_paren_args(GREG *G, char *yytext, int yyleng, yythunk *thunk, YY_XTYPE YY_XVAR)
{
#define a G->val[-1]
  yyprintf((stderr, "do yy_1_paren_args"));
  yyprintfvTcontext(yytext);
  yyprintf((stderr, "\n  {\n\
        if (a->type == PVIP_NODE_LIST) {\n\
            yy = a;\n\
            PVIP_node_change_type(yy, PVIP_NODE_ARGS);\n\
        } else {\n\
            yy = PVIP_node_new_children1(&(G->data), PVIP_NODE_ARGS, a);\n\
        }\n\
    }\n"));
  
        if (a->type == PVIP_NODE_LIST) {
            yy = a;
            PVIP_node_change_type(yy, PVIP_NODE_ARGS);
        } else {
            yy = PVIP_node_new_children1(&(G->data), PVIP_NODE_ARGS, a);
        }
    ;
#undef a
}